

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeysetTest.h
# Opt level: O1

void CombinationKeygenRecurse<Blob<128>,block128>
               (block128 *key,int len,int maxlen,block128 *blocks,int blockcount,pfHash hash,
               vector<Blob<128>,_std::allocator<Blob<128>_>_> *hashes)

{
  char *pcVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  block128 *pbVar17;
  long lVar18;
  Blob<128> h;
  value_type local_48;
  
  if (0 < blockcount && len != maxlen) {
    pbVar17 = key + len;
    lVar18 = 0;
    do {
      pcVar1 = blocks->c + lVar18;
      uVar2 = *(undefined8 *)pcVar1;
      uVar3 = *(undefined8 *)(pcVar1 + 8);
      uVar4 = *(undefined8 *)(pcVar1 + 0x10);
      uVar5 = *(undefined8 *)(pcVar1 + 0x18);
      uVar6 = *(undefined8 *)(pcVar1 + 0x20);
      uVar7 = *(undefined8 *)(pcVar1 + 0x28);
      uVar8 = *(undefined8 *)(pcVar1 + 0x30);
      uVar9 = *(undefined8 *)(pcVar1 + 0x38);
      pcVar1 = blocks->c + lVar18 + 0x40;
      uVar10 = *(undefined8 *)(pcVar1 + 8);
      uVar11 = *(undefined8 *)(pcVar1 + 0x10);
      uVar12 = *(undefined8 *)(pcVar1 + 0x18);
      uVar13 = *(undefined8 *)(pcVar1 + 0x20);
      uVar14 = *(undefined8 *)(pcVar1 + 0x28);
      uVar15 = *(undefined8 *)(pcVar1 + 0x30);
      uVar16 = *(undefined8 *)(pcVar1 + 0x38);
      *(undefined8 *)(pbVar17->c + 0x40) = *(undefined8 *)pcVar1;
      *(undefined8 *)(pbVar17->c + 0x48) = uVar10;
      *(undefined8 *)(pbVar17->c + 0x50) = uVar11;
      *(undefined8 *)(pbVar17->c + 0x58) = uVar12;
      *(undefined8 *)(pbVar17->c + 0x60) = uVar13;
      *(undefined8 *)(pbVar17->c + 0x68) = uVar14;
      *(undefined8 *)(pbVar17->c + 0x70) = uVar15;
      *(undefined8 *)(pbVar17->c + 0x78) = uVar16;
      *(undefined8 *)pbVar17->c = uVar2;
      *(undefined8 *)(pbVar17->c + 8) = uVar3;
      *(undefined8 *)(pbVar17->c + 0x10) = uVar4;
      *(undefined8 *)(pbVar17->c + 0x18) = uVar5;
      *(undefined8 *)(pbVar17->c + 0x20) = uVar6;
      *(undefined8 *)(pbVar17->c + 0x28) = uVar7;
      *(undefined8 *)(pbVar17->c + 0x30) = uVar8;
      *(undefined8 *)(pbVar17->c + 0x38) = uVar9;
      local_48.bytes[0] = '\0';
      local_48.bytes[1] = '\0';
      local_48.bytes[2] = '\0';
      local_48.bytes[3] = '\0';
      local_48.bytes[4] = '\0';
      local_48.bytes[5] = '\0';
      local_48.bytes[6] = '\0';
      local_48.bytes[7] = '\0';
      local_48.bytes[8] = '\0';
      local_48.bytes[9] = '\0';
      local_48.bytes[10] = '\0';
      local_48.bytes[0xb] = '\0';
      local_48.bytes[0xc] = '\0';
      local_48.bytes[0xd] = '\0';
      local_48.bytes[0xe] = '\0';
      local_48.bytes[0xf] = '\0';
      (*hash)(key,(len + 1) * 0x80,0,&local_48);
      std::vector<Blob<128>,_std::allocator<Blob<128>_>_>::push_back(hashes,&local_48);
      CombinationKeygenRecurse<Blob<128>,block128>(key,len + 1,maxlen,blocks,blockcount,hash,hashes)
      ;
      lVar18 = lVar18 + 0x80;
    } while ((ulong)(uint)blockcount << 7 != lVar18);
  }
  return;
}

Assistant:

void CombinationKeygenRecurse ( blocktype * key, int len, int maxlen,
                  blocktype * blocks, int blockcount,
                  pfHash hash, std::vector<hashtype> & hashes )
{
  if(len == maxlen) return;  // end recursion

  for(int i = 0; i < blockcount; i++)
  {
    key[len] = blocks[i];

    //if(len == maxlen-1)
    {
      hashtype h;
      hash(key, (len+1) * sizeof(blocktype), 0, &h);
      hashes.push_back(h);
    }

    //else
    {
      CombinationKeygenRecurse(key,len+1,maxlen,blocks,blockcount,hash,hashes);
    }
  }
}